

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O0

ssize_t __thiscall
vk::DescriptorSetUpdateBuilder::write
          (DescriptorSetUpdateBuilder *this,int __fd,void *__buf,size_t __n)

{
  pointer *this_00;
  pointer *this_01;
  uint in_R8D;
  VkDescriptorImageInfo *in_stack_00000008;
  VkDescriptorBufferInfo *in_stack_00000010;
  Handle<(vk::HandleType)12> *in_stack_00000018;
  __normal_iterator<vk::Handle<(vk::HandleType)12>_*,_std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>_>
  local_100;
  const_iterator local_f8;
  VkDescriptorBufferInfo *local_f0;
  __normal_iterator<vk::VkDescriptorBufferInfo_*,_std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>_>
  local_e8;
  const_iterator local_e0;
  VkDescriptorImageInfo *local_d8;
  __normal_iterator<vk::VkDescriptorImageInfo_*,_std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>_>
  local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [8];
  WriteDescriptorInfo writeInfo;
  VkWriteDescriptorSet writeParams;
  VkDescriptorType descriptorType_local;
  deUint32 count_local;
  deUint32 destArrayElement_local;
  deUint32 destBinding_local;
  DescriptorSetUpdateBuilder *this_local;
  VkDescriptorSet destSet_local;
  
  writeInfo.texelBufferViews.
  super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x23;
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::push_back
            (&this->m_writes,
             (value_type *)
             &writeInfo.texelBufferViews.
              super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  WriteDescriptorInfo::WriteDescriptorInfo((WriteDescriptorInfo *)local_b0);
  if (in_stack_00000008 != (VkDescriptorImageInfo *)0x0) {
    local_c0._M_current =
         (VkDescriptorImageInfo *)
         std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::end
                   ((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *
                    )local_b0);
    __gnu_cxx::
    __normal_iterator<vk::VkDescriptorImageInfo_const*,std::vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>>
    ::__normal_iterator<vk::VkDescriptorImageInfo*>
              ((__normal_iterator<vk::VkDescriptorImageInfo_const*,std::vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>>
                *)&local_b8,&local_c0);
    local_d8 = (VkDescriptorImageInfo *)
               std::vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>::
               insert<vk::VkDescriptorImageInfo_const*,void>
                         ((vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>
                           *)local_b0,local_b8,in_stack_00000008,in_stack_00000008 + in_R8D);
  }
  if (in_stack_00000010 != (VkDescriptorBufferInfo *)0x0) {
    this_01 = &writeInfo.imageInfos.
               super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._M_current =
         (VkDescriptorBufferInfo *)
         std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::end
                   ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                     *)this_01);
    __gnu_cxx::
    __normal_iterator<vk::VkDescriptorBufferInfo_const*,std::vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>>
    ::__normal_iterator<vk::VkDescriptorBufferInfo*>
              ((__normal_iterator<vk::VkDescriptorBufferInfo_const*,std::vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>>
                *)&local_e0,&local_e8);
    local_f0 = (VkDescriptorBufferInfo *)
               std::vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>::
               insert<vk::VkDescriptorBufferInfo_const*,void>
                         ((vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>
                           *)this_01,local_e0,in_stack_00000010,in_stack_00000010 + in_R8D);
  }
  if (in_stack_00000018 != (Handle<(vk::HandleType)12> *)0x0) {
    this_00 = &writeInfo.bufferInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_100._M_current =
         (Handle<(vk::HandleType)12> *)
         std::
         vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
         end((vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
              *)this_00);
    __gnu_cxx::
    __normal_iterator<vk::Handle<(vk::HandleType)12>const*,std::vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>>
    ::__normal_iterator<vk::Handle<(vk::HandleType)12>*>
              ((__normal_iterator<vk::Handle<(vk::HandleType)12>const*,std::vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>>
                *)&local_f8,&local_100);
    std::vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>::
    insert<vk::Handle<(vk::HandleType)12>const*,void>
              ((vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>
                *)this_00,local_f8,in_stack_00000018,in_stack_00000018 + in_R8D);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::push_back(&this->m_writeDescriptorInfos,(value_type *)local_b0);
  WriteDescriptorInfo::~WriteDescriptorInfo((WriteDescriptorInfo *)local_b0);
  return (ssize_t)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::write (VkDescriptorSet					destSet,
															   deUint32							destBinding,
															   deUint32							destArrayElement,
															   deUint32							count,
															   VkDescriptorType					descriptorType,
															   const VkDescriptorImageInfo*		pImageInfo,
															   const VkDescriptorBufferInfo*	pBufferInfo,
															   const VkBufferView*				pTexelBufferView)
{
	// pImageInfo, pBufferInfo and pTexelBufferView will be updated when calling update()
	const VkWriteDescriptorSet writeParams =
	{
		VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
		DE_NULL,
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
		descriptorType,		//!< descriptorType
		DE_NULL,
		DE_NULL,
		DE_NULL
	};

	m_writes.push_back(writeParams);

	// Store a copy of pImageInfo, pBufferInfo and pTexelBufferView
	WriteDescriptorInfo	writeInfo;

	if (pImageInfo)
		writeInfo.imageInfos.insert(writeInfo.imageInfos.end(), pImageInfo, pImageInfo + count);

	if (pBufferInfo)
		writeInfo.bufferInfos.insert(writeInfo.bufferInfos.end(), pBufferInfo, pBufferInfo + count);

	if (pTexelBufferView)
		writeInfo.texelBufferViews.insert(writeInfo.texelBufferViews.end(), pTexelBufferView, pTexelBufferView + count);

	m_writeDescriptorInfos.push_back(writeInfo);

	return *this;
}